

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O0

void __thiscall XMLParser::XMLNode::deleteAttribute(XMLNode *this,int i)

{
  XMLAttribute *__ptr;
  XMLAttribute *p;
  int i_local;
  XMLNode *this_local;
  
  if (((this->d != (XMLNodeData *)0x0) && (-1 < i)) && (i < this->d->nAttribute)) {
    this->d->nAttribute = this->d->nAttribute + -1;
    __ptr = this->d->pAttribute + i;
    free(__ptr->lpszName);
    if (__ptr->lpszValue != (char *)0x0) {
      free(__ptr->lpszValue);
    }
    if (this->d->nAttribute == 0) {
      free(__ptr);
      this->d->pAttribute = (XMLAttribute *)0x0;
    }
    else {
      memmove(__ptr,__ptr + 1,(long)(this->d->nAttribute - i) << 4);
    }
  }
  return;
}

Assistant:

void XMLNode::deleteAttribute(int i)
    {
        if((!d) || (i < 0) || (i >= d->nAttribute))
            return;
        d->nAttribute--;
        XMLAttribute * p = d->pAttribute + i;
        free((void *)p->lpszName);
        if(p->lpszValue)
            free((void *)p->lpszValue);
        if(d->nAttribute)
            memmove(p, p + 1, (d->nAttribute - i) * sizeof(XMLAttribute));
        else
        {
            free(p);
            d->pAttribute = NULL;
        }
    }